

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

void device_reset_iremga20(void *info)

{
  int local_1c;
  int i;
  ga20_state *chip;
  void *info_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    *(undefined4 *)((long)info + (long)local_1c * 0x1c + 0x4c) = 0;
    *(undefined4 *)((long)info + (long)local_1c * 0x1c + 0x50) = 0;
    *(undefined4 *)((long)info + (long)local_1c * 0x1c + 0x54) = 0;
    *(undefined4 *)((long)info + (long)local_1c * 0x1c + 0x58) = 0;
    *(undefined4 *)((long)info + (long)local_1c * 0x1c + 0x5c) = 0;
    *(undefined2 *)((long)info + (long)local_1c * 0x1c + 0x60) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x1c + 0x62) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x1c + 99) = 0;
    *(undefined1 *)((long)info + (long)local_1c * 0x1c + 100) = 0;
  }
  memset((void *)((long)info + 0x2c),0,0x20);
  return;
}

Assistant:

static void device_reset_iremga20(void *info)
{
	ga20_state *chip = (ga20_state *)info;
	int i;

	for( i = 0; i < 4; i++ ) {
		chip->channel[i].start = 0;
		chip->channel[i].end = 0;
		chip->channel[i].pos = 0;
		chip->channel[i].frac = 0;
		chip->channel[i].fracrate = 0;
		chip->channel[i].volume = 0;
		chip->channel[i].rate = 0;
		chip->channel[i].counter = 0;
		chip->channel[i].play = 0;
	}

	memset(chip->regs, 0x00, 0x20 * sizeof(UINT8));
}